

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSGetWorkSpace(void *arkode_mem,long *lenrw,long *leniw)

{
  SUNMatrix A;
  int iVar1;
  int iVar2;
  long liw;
  long lrw;
  ARKLsMem arkls_mem;
  sunindextype liw1;
  sunindextype lrw1;
  ARKodeMem ark_mem;
  long local_58;
  long local_50;
  ARKLsMem local_48;
  int local_40;
  int local_3c;
  ARKodeMem local_38;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSGetWorkSpace",&local_38,&local_48);
  if (iVar1 == 0) {
    *lenrw = 3;
    *leniw = 0x1e;
    if (local_48->x->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
      N_VSpace(local_48->x,&local_3c,&local_40);
      *lenrw = *lenrw + (long)local_3c * 2;
      *leniw = *leniw + (long)local_40 * 2;
    }
    A = local_48->savedJ;
    if ((A != (SUNMatrix)0x0) && (A->ops->space != (_func_int_SUNMatrix_long_ptr_long_ptr *)0x0)) {
      iVar1 = SUNMatSpace(A,&local_50,&local_58);
      if (iVar1 == 0) {
        *lenrw = *lenrw + local_50;
        *leniw = *leniw + local_58;
      }
    }
    iVar1 = 0;
    if (local_48->LS->ops->space != (_func_int_SUNLinearSolver_long_ptr_long_ptr *)0x0) {
      iVar2 = SUNLinSolSpace(local_48->LS,&local_50,&local_58);
      if (iVar2 == 0) {
        *lenrw = *lenrw + local_50;
        *leniw = *leniw + local_58;
      }
    }
  }
  return iVar1;
}

Assistant:

int arkLSGetWorkSpace(void *arkode_mem, long int *lenrw,
                      long int *leniw)
{
  ARKodeMem    ark_mem;
  ARKLsMem     arkls_mem;
  sunindextype lrw1, liw1;
  long int     lrw, liw;
  int          retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSGetWorkSpace",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* start with fixed sizes plus vector/matrix pointers */
  *lenrw = 3;
  *leniw = 30;

  /* add NVector sizes */
  if (arkls_mem->x->ops->nvspace) {
    N_VSpace(arkls_mem->x, &lrw1, &liw1);
    *lenrw += 2*lrw1;
    *leniw += 2*liw1;
  }

  /* add SUNMatrix size (only account for the one owned by Ls interface) */
  if (arkls_mem->savedJ)
    if (arkls_mem->savedJ->ops->space) {
      retval = SUNMatSpace(arkls_mem->savedJ, &lrw, &liw);
      if (retval == 0) {
        *lenrw += lrw;
        *leniw += liw;
      }
    }

  /* add LS sizes */
  if (arkls_mem->LS->ops->space) {
    retval = SUNLinSolSpace(arkls_mem->LS, &lrw, &liw);
    if (retval == SUNLS_SUCCESS) {
      *lenrw += lrw;
      *leniw += liw;
    }
  }

  return(ARKLS_SUCCESS);
}